

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<TPZEqnArray<float>_> * __thiscall
TPZVec<TPZEqnArray<float>_>::operator=
          (TPZVec<TPZEqnArray<float>_> *this,TPZVec<TPZEqnArray<float>_> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  TPZEqnArray<float> *pTVar3;
  TPZEqnArray<float> *pTVar4;
  long lVar5;
  long lVar6;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this,copy->fNElements);
    if (0 < copy->fNElements) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        pTVar3 = copy->fStore;
        pTVar4 = this->fStore;
        puVar1 = (undefined8 *)
                 ((long)(pTVar3->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar5 + -0x28);
        puVar2 = (undefined8 *)
                 ((long)(pTVar4->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar5 + -0x28);
        *puVar2 = *puVar1;
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1));
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)
                   ((long)(pTVar4->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar5 + -0x20
                   ),(TPZManVector<int,_100> *)
                     ((long)(pTVar3->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x20));
        TPZManVector<float,_1000>::operator=
                  ((TPZManVector<float,_1000> *)
                   ((long)(pTVar4->fEqValues).super_TPZManVector<float,_1000>.fExtAlloc +
                   lVar5 + -0x20),
                   (TPZManVector<float,_1000> *)
                   ((long)(pTVar3->fEqValues).super_TPZManVector<float,_1000>.fExtAlloc +
                   lVar5 + -0x20));
        TPZManVector<int,_1000>::operator=
                  ((TPZManVector<int,_1000> *)
                   ((long)(pTVar4->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar5 + -0x20),
                   (TPZManVector<int,_1000> *)
                   ((long)(pTVar3->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar5 + -0x20))
        ;
        *(undefined4 *)(puVar2 + 0x45d) = *(undefined4 *)(puVar1 + 0x45d);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x22f0;
      } while (lVar6 < copy->fNElements);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}